

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_image_flip_vertical_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,void *dst,rf_int dst_size)

{
  rf_image image_00;
  rf_image rVar1;
  int iVar2;
  void *src_pixel;
  void *dst_pixel;
  rf_int x;
  rf_int y;
  int bpp;
  rf_int dst_size_local;
  void *dst_local;
  
  rVar1 = image;
  memset(__return_storage_ptr__,0,0x18);
  if (((undefined1  [24])image & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    image_00._16_8_ = dst_size;
    image_00._0_16_ = image._8_16_;
    iVar2 = rf_image_size(image_00);
    if (iVar2 <= dst_size) {
      iVar2 = rf_bytes_per_pixel(image.format);
      x = 0;
      while( true ) {
        if (image.height <= x) break;
        for (dst_pixel = (void *)0x0; (long)dst_pixel < (long)image.width;
            dst_pixel = (void *)((long)dst_pixel + 1)) {
          memcpy((void *)((long)dst + (long)(x * image.width + (long)dst_pixel) * (long)iVar2),
                 (void *)((long)image.data +
                         (long)(((image.height + -1) - x) * (long)image.width + (long)dst_pixel) *
                         (long)iVar2),(long)iVar2);
        }
        x = x + 1;
      }
      __return_storage_ptr__->data = image.data;
      __return_storage_ptr__->width = image.width;
      __return_storage_ptr__->height = image.height;
      image._16_8_ = rVar1._16_8_;
      __return_storage_ptr__->format = image.format;
      __return_storage_ptr__->valid = image.valid;
      *(undefined3 *)&__return_storage_ptr__->field_0x15 = image._21_3_;
      __return_storage_ptr__->data = dst;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_flip_vertical_to_buffer(rf_image image, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (dst_size >= rf_image_size(image))
        {
            int bpp = rf_bytes_per_pixel(image.format);

            for (rf_int y = 0; y < image.height; y++)
            {
                for (rf_int x = 0; x < image.width; x++)
                {
                    void* dst_pixel = ((unsigned char*)dst) + (y * image.width + x) * bpp;
                    void* src_pixel = ((unsigned char*)image.data) + ((image.height - 1 - y) * image.width + x) * bpp;

                    memcpy(dst_pixel, src_pixel, bpp);
                }
            }

            result = image;
            result.data = dst;
        }
    }

    return result;
}